

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   (duration<long,_std::ratio<1L,_1000000000L>_> *lhs,char *op,
                   duration<long,_std::ratio<1L,_1000000000L>_> *rhs)

{
  String *in_RDI;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>
            (in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>
            (in_stack_ffffffffffffff58);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }